

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O1

void Eigen::internal::gemv_selector<2,1,true>::
     run<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const>,4>,Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
               (GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>
                *prod,Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *dest,Scalar *alpha)

{
  Nested pMVar1;
  ulong uVar2;
  Nested pMVar3;
  double *pdVar4;
  double *lhs;
  long cols;
  long rows;
  double *__ptr;
  undefined8 *puVar5;
  double *pdVar6;
  double *rhs;
  Scalar alpha_00;
  double dStack_38;
  Scalar local_30;
  
  pdVar6 = &dStack_38;
  pMVar1 = (prod->
           super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
           ).m_rhs.m_matrix.m_matrix;
  uVar2 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar2 >> 0x3d == 0) {
    pMVar3 = (prod->
             super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
             ).m_lhs.m_matrix;
    alpha_00 = *alpha;
    rhs = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (rhs == (double *)0x0) {
      if (uVar2 < 0x4001) {
        __ptr = (double *)((long)&dStack_38 - (uVar2 * 8 + 0xf & 0xfffffffffffffff0));
        pdVar6 = __ptr;
        rhs = __ptr;
      }
      else {
        local_30 = alpha_00;
        __ptr = (double *)malloc(uVar2 * 8);
        rhs = __ptr;
        alpha_00 = local_30;
        if (__ptr == (double *)0x0) goto LAB_00112ed8;
      }
    }
    else {
      __ptr = (double *)0x0;
      pdVar6 = &dStack_38;
    }
    pdVar4 = (dest->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
             m_storage.m_data;
    if ((pdVar4 != (double *)0x0) &&
       ((dest->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
        m_cols < 0)) {
      pdVar6[-1] = 5.56407343099141e-318;
      __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/MapBase.h"
                    ,0x94,
                    "Eigen::MapBase<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double, 1, -1>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Transpose<Eigen::Matrix<double, 1, -1>>, -1, 1, true>, Level = 0]"
                   );
    }
    lhs = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_data;
    cols = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
    rows = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
    pdVar6[-1] = 4.94065645841247e-324;
    pdVar6[-2] = (double)pdVar4;
    pdVar6[-3] = 5.56352501812452e-318;
    general_matrix_vector_product<long,_double,_1,_false,_double,_false,_0>::run
              (rows,cols,lhs,cols,rhs,1,(ResScalar *)pdVar6[-2],(long)pdVar6[-1],alpha_00);
    if (0x4000 < uVar2) {
      pdVar6[-1] = 5.56362877191015e-318;
      free(__ptr);
    }
    return;
  }
LAB_00112ed8:
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = operator_delete;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static void run(const ProductType& prod, Dest& dest, const typename ProductType::Scalar& alpha)
  {
    typedef typename ProductType::LhsScalar LhsScalar;
    typedef typename ProductType::RhsScalar RhsScalar;
    typedef typename ProductType::Scalar    ResScalar;
    typedef typename ProductType::Index Index;
    typedef typename ProductType::ActualLhsType ActualLhsType;
    typedef typename ProductType::ActualRhsType ActualRhsType;
    typedef typename ProductType::_ActualRhsType _ActualRhsType;
    typedef typename ProductType::LhsBlasTraits LhsBlasTraits;
    typedef typename ProductType::RhsBlasTraits RhsBlasTraits;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(prod.lhs());
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(prod.rhs());

    ResScalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(prod.lhs())
                                  * RhsBlasTraits::extractScalarFactor(prod.rhs());

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = _ActualRhsType::InnerStrideAtCompileTime==1
    };

    gemv_static_vector_if<RhsScalar,_ActualRhsType::SizeAtCompileTime,_ActualRhsType::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      int size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename _ActualRhsType::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    general_matrix_vector_product
      <Index,LhsScalar,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        actualLhs.data(), actualLhs.outerStride(),
        actualRhsPtr, 1,
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }